

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indonesia.h
# Opt level: O0

void __thiscall Maluku::resize(Maluku *this,float skala)

{
  Halmahera *pHVar1;
  Ambon *pAVar2;
  Seram *pSVar3;
  double dVar4;
  Point<double> local_60;
  Point<double> local_48;
  Point<double> local_30;
  float local_14;
  Maluku *pMStack_10;
  float skala_local;
  Maluku *this_local;
  
  pHVar1 = this->halmahera;
  local_14 = skala;
  pMStack_10 = this;
  Point<double>::Point(&local_30,683.0,384.0,0.0);
  Polygon::resize((double)skala,(Point_conflict *)pHVar1);
  pAVar2 = this->ambon;
  dVar4 = (double)local_14;
  Point<double>::Point(&local_48,683.0,384.0,0.0);
  Polygon::resize(dVar4,(Point_conflict *)pAVar2);
  pSVar3 = this->seram;
  dVar4 = (double)local_14;
  Point<double>::Point(&local_60,683.0,384.0,0.0);
  Polygon::resize(dVar4,(Point_conflict *)pSVar3);
  return;
}

Assistant:

void resize(float skala){
      halmahera->resize(skala,Point<double>(tengah_A,tengah_B));
      ambon->resize(skala,Point<double>(tengah_A,tengah_B));
      seram->resize(skala,Point<double>(tengah_A,tengah_B));
      
    
    }